

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O1

void av1_copy_and_extend_frame(YV12_BUFFER_CONFIG *src,YV12_BUFFER_CONFIG *dst)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int src_pitch;
  int dst_pitch;
  uint8_t *dst8;
  uint uVar5;
  uint8_t *puVar6;
  int extend_bottom;
  int extend_top;
  int extend_bottom_00;
  int extend_right;
  int extend_left;
  uint uVar7;
  int extend_right_00;
  int iVar8;
  
  iVar8 = dst->border;
  iVar3 = (src->field_0).field_0.y_width;
  iVar4 = (src->field_1).field_0.y_height;
  uVar5 = iVar3 + iVar8;
  uVar7 = iVar3 + 0x3fU & 0xffffffc0;
  if ((int)uVar7 < (int)uVar5) {
    uVar7 = uVar5;
  }
  iVar3 = (src->field_2).field_0.y_crop_width;
  extend_right_00 = uVar7 - iVar3;
  uVar5 = iVar4 + iVar8;
  uVar7 = iVar4 + 0x3fU & 0xffffffc0;
  if ((int)uVar7 < (int)uVar5) {
    uVar7 = uVar5;
  }
  bVar1 = (byte)src->subsampling_x;
  bVar2 = (byte)src->subsampling_y;
  extend_top = iVar8 >> (bVar2 & 0x1f);
  extend_left = iVar8 >> (bVar1 & 0x1f);
  iVar4 = (src->field_3).field_0.y_crop_height;
  extend_bottom_00 = uVar7 - iVar4;
  extend_bottom = extend_bottom_00 >> (bVar2 & 0x1f);
  extend_right = extend_right_00 >> (bVar1 & 0x1f);
  puVar6 = (src->field_5).field_0.y_buffer;
  src_pitch = (src->field_4).field_0.y_stride;
  dst8 = (dst->field_5).field_0.y_buffer;
  dst_pitch = (dst->field_4).field_0.y_stride;
  if ((src->flags & 8) == 0) {
    copy_and_extend_plane
              (puVar6,src_pitch,dst8,dst_pitch,iVar3,iVar4,iVar8,iVar8,extend_bottom_00,
               extend_right_00,1);
    if (src->monochrome == '\0') {
      puVar6 = (src->field_5).field_0.v_buffer;
      iVar8 = (puVar6 == (uint8_t *)0x0) + 1;
      if (puVar6 == (uint8_t *)0x0) {
        puVar6 = (src->field_5).buffers[1] + 1;
      }
      copy_and_extend_plane
                ((src->field_5).field_0.u_buffer,(src->field_4).field_0.uv_stride,
                 (dst->field_5).field_0.u_buffer,(dst->field_4).field_0.uv_stride,
                 (src->field_2).field_0.uv_crop_width,(src->field_3).field_0.uv_crop_height,
                 extend_top,extend_left,extend_bottom,extend_right,iVar8);
      copy_and_extend_plane
                (puVar6,(src->field_4).field_0.uv_stride,(dst->field_5).field_0.v_buffer,
                 (dst->field_4).field_0.uv_stride,(src->field_2).field_0.uv_crop_width,
                 (src->field_3).field_0.uv_crop_height,extend_top,extend_left,extend_bottom,
                 extend_right,iVar8);
    }
  }
  else {
    highbd_copy_and_extend_plane
              (puVar6,src_pitch,dst8,dst_pitch,iVar3,iVar4,iVar8,iVar8,extend_bottom_00,
               extend_right_00);
    if (src->monochrome == '\0') {
      highbd_copy_and_extend_plane
                ((src->field_5).field_0.u_buffer,(src->field_4).field_0.uv_stride,
                 (dst->field_5).field_0.u_buffer,(dst->field_4).field_0.uv_stride,
                 (src->field_2).field_0.uv_crop_width,(src->field_3).field_0.uv_crop_height,
                 extend_top,extend_left,extend_bottom,extend_right);
      highbd_copy_and_extend_plane
                ((src->field_5).field_0.v_buffer,(src->field_4).field_0.uv_stride,
                 (dst->field_5).field_0.v_buffer,(dst->field_4).field_0.uv_stride,
                 (src->field_2).field_0.uv_crop_width,(src->field_3).field_0.uv_crop_height,
                 extend_top,extend_left,extend_bottom,extend_right);
    }
  }
  return;
}

Assistant:

void av1_copy_and_extend_frame(const YV12_BUFFER_CONFIG *src,
                               YV12_BUFFER_CONFIG *dst) {
  // Extend src frame in buffer
  const int et_y = dst->border;
  const int el_y = dst->border;
  const int er_y =
      AOMMAX(src->y_width + dst->border, ALIGN_POWER_OF_TWO(src->y_width, 6)) -
      src->y_crop_width;
  const int eb_y = AOMMAX(src->y_height + dst->border,
                          ALIGN_POWER_OF_TWO(src->y_height, 6)) -
                   src->y_crop_height;
  const int uv_width_subsampling = src->subsampling_x;
  const int uv_height_subsampling = src->subsampling_y;
  const int et_uv = et_y >> uv_height_subsampling;
  const int el_uv = el_y >> uv_width_subsampling;
  const int eb_uv = eb_y >> uv_height_subsampling;
  const int er_uv = er_y >> uv_width_subsampling;

  if (src->flags & YV12_FLAG_HIGHBITDEPTH) {
    highbd_copy_and_extend_plane(src->y_buffer, src->y_stride, dst->y_buffer,
                                 dst->y_stride, src->y_crop_width,
                                 src->y_crop_height, et_y, el_y, eb_y, er_y);
    if (!src->monochrome) {
      highbd_copy_and_extend_plane(
          src->u_buffer, src->uv_stride, dst->u_buffer, dst->uv_stride,
          src->uv_crop_width, src->uv_crop_height, et_uv, el_uv, eb_uv, er_uv);
      highbd_copy_and_extend_plane(
          src->v_buffer, src->uv_stride, dst->v_buffer, dst->uv_stride,
          src->uv_crop_width, src->uv_crop_height, et_uv, el_uv, eb_uv, er_uv);
    }
    return;
  }

  copy_and_extend_plane(src->y_buffer, src->y_stride, dst->y_buffer,
                        dst->y_stride, src->y_crop_width, src->y_crop_height,
                        et_y, el_y, eb_y, er_y, 1);
  if (!src->monochrome) {
    // detect nv12 format
    const int chroma_step = src->v_buffer ? 1 : 2;
    const uint8_t *src_v_buffer =
        src->v_buffer ? src->v_buffer : src->u_buffer + 1;
    copy_and_extend_plane(src->u_buffer, src->uv_stride, dst->u_buffer,
                          dst->uv_stride, src->uv_crop_width,
                          src->uv_crop_height, et_uv, el_uv, eb_uv, er_uv,
                          chroma_step);
    copy_and_extend_plane(src_v_buffer, src->uv_stride, dst->v_buffer,
                          dst->uv_stride, src->uv_crop_width,
                          src->uv_crop_height, et_uv, el_uv, eb_uv, er_uv,
                          chroma_step);
  }
}